

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_ptr.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<char_const*,void>::operator()
          (pack<const_char_*,_void> *this,packer<msgpack::v1::sbuffer> *o,char *v)

{
  uint32_t l;
  char *in_RDX;
  packer<msgpack::v1::sbuffer> *in_RSI;
  uint32_t size;
  
  strlen(in_RDX);
  l = checked_get_container_size<unsigned_long>(0x202695);
  packer<msgpack::v1::sbuffer>::pack_str(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
  packer<msgpack::v1::sbuffer>::pack_str_body(in_RSI,in_RDX,l);
  return in_RSI;
}

Assistant:

msgpack::packer<Stream>& operator()(msgpack::packer<Stream>& o, const char* v) const {
        uint32_t size = checked_get_container_size(std::strlen(v));
        o.pack_str(size);
        o.pack_str_body(v, size);
        return o;
    }